

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDefinitions.cxx
# Opt level: O0

void __thiscall cmDefinitions::Set(cmDefinitions *this,string *key,string_view value)

{
  mapped_type *this_00;
  String local_78;
  cmDefinitions *local_58;
  char *pcStack_50;
  Def local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *key_local;
  cmDefinitions *this_local;
  string_view value_local;
  
  pcStack_50 = value._M_str;
  local_58 = (cmDefinitions *)value._M_len;
  local_28 = key;
  key_local = (string *)this;
  this_local = local_58;
  value_local._M_len = (size_t)pcStack_50;
  Def::Def(&local_48,value);
  ::cm::String::String<std::__cxx11::string_const&,void>(&local_78,local_28);
  this_00 = std::
            unordered_map<cm::String,_cmDefinitions::Def,_std::hash<cm::String>,_std::equal_to<cm::String>,_std::allocator<std::pair<const_cm::String,_cmDefinitions::Def>_>_>
            ::operator[](&this->Map,&local_78);
  Def::operator=(this_00,&local_48);
  ::cm::String::~String(&local_78);
  Def::~Def(&local_48);
  return;
}

Assistant:

void cmDefinitions::Set(const std::string& key, cm::string_view value)
{
  this->Map[key] = Def(value);
}